

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BoxObjectiveFunction.cpp
# Opt level: O3

void __thiscall
OpenMD::BoxObjectiveFunction::getGrad
          (BoxObjectiveFunction *this,DynamicVector<double,_std::allocator<double>_> *grad)

{
  pointer pdVar1;
  double dVar2;
  pointer pdVar3;
  double dVar4;
  RealType RVar5;
  undefined8 uVar6;
  uint i_4;
  long lVar7;
  double *pdVar8;
  uint i;
  uint j;
  long lVar9;
  double (*padVar10) [3];
  double *pdVar11;
  uint j_3;
  double (*padVar12) [3];
  uint k;
  long lVar13;
  double *pdVar14;
  uint k_1;
  double (*__return_storage_ptr__) [3];
  Mat3x3d tao;
  Mat3x3d pressureTensor;
  SquareMatrix3<double> result;
  Mat3x3d idm;
  double local_188 [10];
  double local_138 [16];
  double local_b8 [10];
  double local_68 [9];
  
  local_138[0xc] = 0.0;
  local_138[0xd] = 0.0;
  local_138[10] = 0.0;
  local_138[0xb] = 0.0;
  local_138[8] = 0.0;
  local_138[9] = 0.0;
  local_138[6] = 0.0;
  local_138[7] = 0.0;
  local_138[0xe] = 0.0;
  local_138[4] = 0.0;
  local_138[5] = 0.0;
  local_138[2] = 0.0;
  local_138[3] = 0.0;
  local_138[0] = 0.0;
  local_138[1] = 0.0;
  SquareMatrix3<double>::inverse((SquareMatrix3<double> *)local_68,&this->deformation_);
  dVar4 = SquareMatrix3<double>::determinant(&this->deformation_);
  __return_storage_ptr__ = (double (*) [3])local_188;
  Thermo::getPressureTensor((Mat3x3d *)__return_storage_ptr__,&this->thermo);
  lVar7 = 0;
  do {
    *(undefined8 *)((long)local_138 + lVar7 + 0x40) =
         *(undefined8 *)((long)local_188 + lVar7 + 0x10);
    uVar6 = *(undefined8 *)((long)local_188 + lVar7 + 8);
    *(undefined8 *)((long)local_138 + lVar7 + 0x30) = *(undefined8 *)((long)local_188 + lVar7);
    *(undefined8 *)((long)local_138 + lVar7 + 0x38) = uVar6;
    lVar7 = lVar7 + 0x18;
  } while (lVar7 != 0x48);
  pdVar8 = local_138 + 6;
  lVar7 = 0;
  do {
    lVar9 = 0;
    do {
      pdVar8[lVar9] = -pdVar8[lVar9];
      lVar9 = lVar9 + 1;
    } while (lVar9 != 3);
    lVar7 = lVar7 + 1;
    pdVar8 = pdVar8 + 3;
  } while (lVar7 != 3);
  pdVar8 = local_138 + 6;
  lVar7 = 0;
  do {
    lVar9 = 0;
    do {
      pdVar8[lVar9] = pdVar8[lVar9] * 16605.3386;
      lVar9 = lVar9 + 1;
    } while (lVar9 != 3);
    lVar7 = lVar7 + 1;
    pdVar8 = pdVar8 + 3;
  } while (lVar7 != 3);
  local_b8[6] = 0.0;
  local_b8[7] = 0.0;
  local_b8[4] = 0.0;
  local_b8[5] = 0.0;
  local_b8[2] = 0.0;
  local_b8[3] = 0.0;
  local_b8[0] = 0.0;
  local_b8[1] = 0.0;
  local_b8[8] = 0.0;
  pdVar8 = local_138 + 6;
  lVar7 = 0;
  do {
    lVar9 = 0;
    padVar10 = (double (*) [3])local_68;
    do {
      dVar2 = local_b8[lVar7 * 3 + lVar9];
      lVar13 = 0;
      padVar12 = padVar10;
      do {
        dVar2 = dVar2 + pdVar8[lVar13] *
                        (((SquareMatrix<double,_3> *)*padVar12)->super_RectMatrix<double,_3U,_3U>).
                        data_[0][0];
        lVar13 = lVar13 + 1;
        padVar12 = padVar12 + 1;
      } while (lVar13 != 3);
      local_b8[lVar7 * 3 + lVar9] = dVar2;
      lVar9 = lVar9 + 1;
      padVar10 = (double (*) [3])(*padVar10 + 1);
    } while (lVar9 != 3);
    lVar7 = lVar7 + 1;
    pdVar8 = pdVar8 + 3;
  } while (lVar7 != 3);
  local_188[6] = 0.0;
  local_188[7] = 0.0;
  local_188[4] = 0.0;
  local_188[5] = 0.0;
  local_188[2] = 0.0;
  local_188[3] = 0.0;
  local_188[0] = 0.0;
  local_188[1] = 0.0;
  local_188[8] = 0.0;
  pdVar8 = local_68;
  lVar7 = 0;
  do {
    lVar9 = 0;
    pdVar11 = local_b8;
    do {
      dVar2 = local_188[lVar7 * 3 + lVar9];
      lVar13 = 0;
      pdVar14 = pdVar11;
      do {
        dVar2 = dVar2 + pdVar8[lVar13] * *pdVar14;
        lVar13 = lVar13 + 1;
        pdVar14 = pdVar14 + 3;
      } while (lVar13 != 3);
      local_188[lVar7 * 3 + lVar9] = dVar2;
      lVar9 = lVar9 + 1;
      pdVar11 = pdVar11 + 1;
    } while (lVar9 != 3);
    lVar7 = lVar7 + 1;
    pdVar8 = pdVar8 + 3;
  } while (lVar7 != 3);
  lVar7 = 0;
  do {
    lVar9 = 0;
    do {
      (((SquareMatrix<double,_3> *)*__return_storage_ptr__)->super_RectMatrix<double,_3U,_3U>).data_
      [0][lVar9] = (((SquareMatrix<double,_3> *)*__return_storage_ptr__)->
                   super_RectMatrix<double,_3U,_3U>).data_[0][lVar9] * dVar4;
      lVar9 = lVar9 + 1;
    } while (lVar9 != 3);
    lVar7 = lVar7 + 1;
    __return_storage_ptr__ = __return_storage_ptr__ + 1;
  } while (lVar7 != 3);
  local_138[5] = (local_188[1] + local_188[3]) * 0.5;
  local_138[0] = local_188[0];
  local_138[1] = local_188[4];
  local_138[2] = local_188[8];
  local_138[3] = (local_188[5] + local_188[7]) * 0.5;
  local_138[4] = (local_188[2] + local_188[6]) * 0.5;
  RVar5 = Thermo::getVolume(&this->thermo);
  pdVar3 = (grad->data_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar7 = 0;
  do {
    dVar4 = local_138[lVar7 + 1];
    pdVar1 = pdVar3 + lVar7;
    *pdVar1 = local_138[lVar7] * RVar5;
    pdVar1[1] = dVar4 * RVar5;
    lVar7 = lVar7 + 2;
  } while (lVar7 != 6);
  return;
}

Assistant:

void BoxObjectiveFunction::getGrad(DynamicVector<RealType>& grad) {
    Mat3x3d pressureTensor;
    Vector<RealType, 6> lstress(0.0);

    // Find the Lagragian stress tensor, τ, from the physical
    // stress tensor, σ, that was computed from the pressureTensor
    // in this code.
    // τ = det(1+ε) (1+ε)^−1 · σ · (1+ε)^−1
    // (Note that 1+ε is the deformation tensor computed above.)

    Mat3x3d idm  = deformation_.inverse();
    RealType ddm = deformation_.determinant();

    pressureTensor = thermo.getPressureTensor();
    pressureTensor.negate();
    pressureTensor *= Constants::elasticConvert;

    Mat3x3d tao = idm * (pressureTensor * idm);
    tao *= ddm;

    lstress    = tao.toVoigtTensor();
    RealType V = thermo.getVolume();

    for (int j = 0; j < 6; j++) {
      grad[j] = V * lstress[j];
    }
  }